

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O3

int p256_auth_decap(EVP_HPKE_KEY *key,uint8_t *out_shared_secret,size_t *out_shared_secret_len,
                   uint8_t *enc,size_t enc_len,uint8_t *peer_public_key,size_t peer_public_key_len)

{
  uint16_t kem_id;
  int iVar1;
  EVP_MD *hkdf_md;
  uint8_t dh [64];
  uint8_t kem_context [195];
  size_t in_stack_fffffffffffffec0;
  uint8_t local_138 [32];
  uint8_t local_118 [32];
  undefined1 local_f8 [65];
  undefined1 local_b7 [65];
  undefined1 local_76 [70];
  
  if (peer_public_key_len == 0x41 && enc_len == 0x41) {
    iVar1 = p256(local_138,key->private_key,enc);
    if ((iVar1 != 0) && (iVar1 = p256(local_118,key->private_key,peer_public_key), iVar1 != 0)) {
      memcpy(local_f8,enc,0x41);
      memcpy(local_b7,key->public_key,0x41);
      memcpy(local_76,peer_public_key,0x41);
      kem_id = key->kem->id;
      hkdf_md = EVP_sha256();
      iVar1 = dhkem_extract_and_expand
                        (kem_id,(EVP_MD *)hkdf_md,out_shared_secret,(size_t)local_138,
                         (uint8_t *)0x40,(size_t)local_f8,(uint8_t *)0xc3,in_stack_fffffffffffffec0)
      ;
      if (iVar1 != 0) {
        *out_shared_secret_len = 0x20;
        return 1;
      }
      return 0;
    }
  }
  ERR_put_error(6,0,0x86,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                ,0x237);
  return 0;
}

Assistant:

static int p256_auth_decap(const EVP_HPKE_KEY *key, uint8_t *out_shared_secret,
                           size_t *out_shared_secret_len, const uint8_t *enc,
                           size_t enc_len, const uint8_t *peer_public_key,
                           size_t peer_public_key_len) {
  uint8_t dh[2 * P256_SHARED_KEY_LEN];
  if (enc_len != P256_PUBLIC_VALUE_LEN ||
      peer_public_key_len != P256_PUBLIC_VALUE_LEN ||
      !p256(dh, key->private_key, enc) ||
      !p256(dh + P256_SHARED_KEY_LEN, key->private_key, peer_public_key)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PEER_KEY);
    return 0;
  }

  uint8_t kem_context[3 * P256_PUBLIC_VALUE_LEN];
  OPENSSL_memcpy(kem_context, enc, P256_PUBLIC_VALUE_LEN);
  OPENSSL_memcpy(kem_context + P256_PUBLIC_VALUE_LEN, key->public_key,
                 P256_PUBLIC_VALUE_LEN);
  OPENSSL_memcpy(kem_context + 2 * P256_PUBLIC_VALUE_LEN, peer_public_key,
                 P256_PUBLIC_VALUE_LEN);
  if (!dhkem_extract_and_expand(key->kem->id, EVP_sha256(), out_shared_secret,
                                SHA256_DIGEST_LENGTH, dh, sizeof(dh),
                                kem_context, sizeof(kem_context))) {
    return 0;
  }

  *out_shared_secret_len = SHA256_DIGEST_LENGTH;
  return 1;
}